

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall
asmjit::CodeHolder::newNamedLabelId
          (CodeHolder *this,uint32_t *idOut,char *name,size_t nameLength,uint32_t type,
          uint32_t parentId)

{
  ZoneHeap *heap;
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  Error EVar6;
  ZoneHashNode *pZVar7;
  undefined4 extraout_var;
  uint32_t uVar8;
  ZoneHashNode *__s1;
  uint uVar9;
  ulong local_40;
  size_t local_38;
  
  *idOut = 0;
  local_40 = nameLength;
  uVar4 = anon_unknown_32::CodeHolder_hashNameAndFixLen(name,&local_40);
  uVar3 = local_40;
  if (local_40 == 0) {
    EVar6 = 0x11;
  }
  else if (local_40 < 0x801) {
    if (type == 2) {
      if (parentId != 0) {
        return 0x13;
      }
    }
    else {
      if (type != 1) {
        return 3;
      }
      if ((this->_labels).super_ZoneVectorBase._length <= (ulong)(parentId - 0x100)) {
        return 0x12;
      }
      uVar4 = uVar4 ^ parentId;
    }
    pZVar7 = (this->_namedLabels).super_ZoneHashBase._data
             [(ulong)uVar4 % (ulong)(this->_namedLabels).super_ZoneHashBase._bucketsCount];
    while( true ) {
      uVar9 = (uint)uVar3;
      if (pZVar7 == (ZoneHashNode *)0x0) break;
      if (*(uint *)(pZVar7 + 0x30) == uVar9) {
        if (*(uint *)(pZVar7 + 0x30) < 0xc) {
          __s1 = pZVar7 + 0x34;
        }
        else {
          __s1 = *(ZoneHashNode **)(pZVar7 + 0x38);
        }
        iVar5 = bcmp(__s1,name,uVar3);
        if (iVar5 == 0) {
          if (pZVar7 != (ZoneHashNode *)0x0) {
            return 0xf;
          }
          break;
        }
      }
      pZVar7 = *(ZoneHashNode **)pZVar7;
    }
    uVar2 = (this->_labels).super_ZoneVectorBase._length;
    if (uVar2 >> 8 < 0xffffff) {
      heap = &this->_baseHeap;
      EVar6 = 0;
      if ((this->_labels).super_ZoneVectorBase._capacity == uVar2) {
        EVar6 = ZoneVectorBase::_grow(&(this->_labels).super_ZoneVectorBase,heap,8,1);
      }
      if (EVar6 == 0) {
        if (heap->_zone == (Zone *)0x0) {
          newNamedLabelId();
        }
        else {
          pZVar7 = (ZoneHashNode *)ZoneHeap::_allocZeroed(heap,0x40,&local_38);
          if (pZVar7 != (ZoneHashNode *)0x0) {
            uVar8 = (int)uVar2 + 0x100;
            *(uint *)(pZVar7 + 8) = uVar4;
            *(uint32_t *)(pZVar7 + 0xc) = uVar8;
            pZVar7[0x10] = SUB41(type,0);
            *(undefined8 *)(pZVar7 + 0x14) = 0xffffffff00000000;
            *(undefined8 *)(pZVar7 + 0x20) = 0;
            if (uVar3 < 0xc) {
              *(uint *)(pZVar7 + 0x30) = uVar9;
              memcpy(pZVar7 + 0x34,name,uVar3);
              pZVar7[uVar3 + 0x34] = (ZoneHashNode)0x0;
            }
            else {
              iVar5 = Zone::dup(&this->_dataZone,(int)name);
              if (CONCAT44(extraout_var,iVar5) == 0) {
                return 1;
              }
              *(uint *)(pZVar7 + 0x30) = uVar9;
              *(long *)(pZVar7 + 0x38) = CONCAT44(extraout_var,iVar5);
            }
            uVar3 = (this->_labels).super_ZoneVectorBase._length;
            if ((this->_labels).super_ZoneVectorBase._capacity <= uVar3) {
              newNamedLabelId();
              return 0xf;
            }
            *(ZoneHashNode **)((long)(this->_labels).super_ZoneVectorBase._data + uVar3 * 8) =
                 pZVar7;
            psVar1 = &(this->_labels).super_ZoneVectorBase._length;
            *psVar1 = *psVar1 + 1;
            ZoneHashBase::_put(&(this->_namedLabels).super_ZoneHashBase,pZVar7);
            *idOut = uVar8;
            return 0;
          }
        }
        EVar6 = 1;
      }
    }
    else {
      EVar6 = 0xd;
    }
  }
  else {
    EVar6 = 0x10;
  }
  return EVar6;
}

Assistant:

Error CodeHolder::newNamedLabelId(uint32_t& idOut, const char* name, size_t nameLength, uint32_t type, uint32_t parentId) noexcept {
  idOut = 0;
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);

  if (ASMJIT_UNLIKELY(nameLength == 0))
    return DebugUtils::errored(kErrorInvalidLabelName);

  if (ASMJIT_UNLIKELY(nameLength > Globals::kMaxLabelLength))
    return DebugUtils::errored(kErrorLabelNameTooLong);

  switch (type) {
    case Label::kTypeLocal:
      if (ASMJIT_UNLIKELY(Operand::unpackId(parentId) >= _labels.getLength()))
        return DebugUtils::errored(kErrorInvalidParentLabel);

      hVal ^= parentId;
      break;

    case Label::kTypeGlobal:
      if (ASMJIT_UNLIKELY(parentId != 0))
        return DebugUtils::errored(kErrorNonLocalLabelCantHaveParent);

      break;

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }

  // Don't allow to insert duplicates. Local labels allow duplicates that have
  // different id, this is already accomplished by having a different hashes
  // between the same label names having different parent labels.
  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  if (ASMJIT_UNLIKELY(le))
    return DebugUtils::errored(kErrorLabelAlreadyDefined);

  Error err = kErrorOk;
  size_t index = _labels.getLength();

  if (ASMJIT_UNLIKELY(index >= Operand::kPackedIdCount))
    return DebugUtils::errored(kErrorLabelIndexOverflow);

  ASMJIT_PROPAGATE(_labels.willGrow(&_baseHeap));
  le = _baseHeap.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return  DebugUtils::errored(kErrorNoHeapMemory);

  uint32_t id = Operand::packId(static_cast<uint32_t>(index));
  le->_hVal = hVal;
  le->_setId(id);
  le->_type = static_cast<uint8_t>(type);
  le->_parentId = 0;
  le->_sectionId = SectionEntry::kInvalidId;
  le->_offset = 0;

  if (le->_name.mustEmbed(nameLength)) {
    le->_name.setEmbedded(name, nameLength);
  }
  else {
    char* nameExternal = static_cast<char*>(_dataZone.dup(name, nameLength, true));
    if (ASMJIT_UNLIKELY(!nameExternal))
      return DebugUtils::errored(kErrorNoHeapMemory);
    le->_name.setExternal(nameExternal, nameLength);
  }

  _labels.appendUnsafe(le);
  _namedLabels.put(le);

  idOut = id;
  return err;
}